

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void * ImLoadFileToMemory(char *filename,char *file_open_mode,int *out_file_size,int padding_bytes)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  size_t sVar3;
  void *file_data;
  int file_size;
  long file_size_signed;
  FILE *f;
  int padding_bytes_local;
  int *out_file_size_local;
  char *file_open_mode_local;
  char *filename_local;
  
  if (filename == (char *)0x0 || file_open_mode == (char *)0x0) {
    __assert_fail("filename && file_open_mode",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                  ,0x4f5,"void *ImLoadFileToMemory(const char *, const char *, int *, int)");
  }
  if (out_file_size != (int *)0x0) {
    *out_file_size = 0;
  }
  __stream = fopen(filename,file_open_mode);
  if (__stream == (FILE *)0x0) {
    filename_local = (char *)0x0;
  }
  else {
    iVar1 = fseek(__stream,0,2);
    if (((iVar1 == 0) && (lVar2 = ftell(__stream), lVar2 != -1)) &&
       (iVar1 = fseek(__stream,0,0), iVar1 == 0)) {
      iVar1 = (int)lVar2;
      filename_local = (char *)ImGui::MemAlloc((long)(iVar1 + padding_bytes));
      if (filename_local == (char *)0x0) {
        fclose(__stream);
        filename_local = (char *)0x0;
      }
      else {
        sVar3 = fread(filename_local,1,(long)iVar1,__stream);
        if (sVar3 == (long)iVar1) {
          if (0 < padding_bytes) {
            memset(filename_local + iVar1,0,(long)padding_bytes);
          }
          fclose(__stream);
          if (out_file_size != (int *)0x0) {
            *out_file_size = iVar1;
          }
        }
        else {
          fclose(__stream);
          ImGui::MemFree(filename_local);
          filename_local = (char *)0x0;
        }
      }
    }
    else {
      fclose(__stream);
      filename_local = (char *)0x0;
    }
  }
  return filename_local;
}

Assistant:

void* ImLoadFileToMemory(const char* filename, const char* file_open_mode, int* out_file_size, int padding_bytes)
{
    IM_ASSERT(filename && file_open_mode);
    if (out_file_size)
        *out_file_size = 0;

    FILE* f;
    if ((f = fopen(filename, file_open_mode)) == NULL)
        return NULL;

    long file_size_signed;
    if (fseek(f, 0, SEEK_END) || (file_size_signed = ftell(f)) == -1 || fseek(f, 0, SEEK_SET))
    {
        fclose(f);
        return NULL;
    }

    int file_size = (int)file_size_signed;
    void* file_data = ImGui::MemAlloc(file_size + padding_bytes);
    if (file_data == NULL)
    {
        fclose(f);
        return NULL;
    }
    if (fread(file_data, 1, (size_t)file_size, f) != (size_t)file_size)
    {
        fclose(f);
        ImGui::MemFree(file_data);
        return NULL;
    }
    if (padding_bytes > 0)
        memset((void *)(((char*)file_data) + file_size), 0, padding_bytes);

    fclose(f);
    if (out_file_size)
        *out_file_size = file_size;

    return file_data;
}